

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O3

bool test_window2<24>(void)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = 0;
  iVar2 = 0;
  do {
    if ((ushort)((uVar1 / 1000) * -1000) == (short)iVar2) {
      putchar(0x2e);
    }
    iVar2 = iVar2 + -1;
    uVar1 = uVar1 + 1;
  } while (iVar2 != -10000);
  printf("PASS %d\n",0x18);
  return true;
}

Assistant:

bool test_window2 ( void )
{
  Rand r(83874);

  struct keytype
  {
    uint8_t bytes[nbits/8];
  };

  int nbytes = nbits / 8;
  int reps = 10000;

  for(int j = 0; j < reps; j++)
  {
    if(j % (reps/10) == 0) printf(".");

    keytype k;

    r.rand_p(&k,nbytes);

    for(int start = 0; start < nbits; start++)
    {
      for(int count = 0; count < 32; count++)
      {
        uint32_t a = window1(&k,nbytes,start,count);
        uint32_t b = window8(&k,nbytes,start,count);
        uint32_t c = window(&k,nbytes,start,count);

        assert(a == b);
        assert(a == c);
      }
    }
  }

  printf("PASS %d\n",nbits);

  return true;
}